

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O2

void __thiscall
ParsedH266TrackData::ParsedH266TrackData(ParsedH266TrackData *this,uint8_t *buff,int size)

{
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_30;
  
  ParsedH264TrackData::ParsedH264TrackData(&this->super_ParsedH264TrackData,(uint8_t *)0x0,0);
  (this->super_ParsedH264TrackData).super_ParsedTrackPrivData._vptr_ParsedTrackPrivData =
       (_func_int **)&PTR__ParsedH264TrackData_0024af60;
  vvc_extract_priv_data(&local_30,buff,size,&(this->super_ParsedH264TrackData).m_nalSize);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::_M_move_assign(&(this->super_ParsedH264TrackData).m_spsPpsList,&local_30);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_30);
  return;
}

Assistant:

ParsedH266TrackData::ParsedH266TrackData(const uint8_t* buff, const int size) : ParsedH264TrackData(nullptr, 0)
{
    m_spsPpsList = vvc_extract_priv_data(buff, size, &m_nalSize);
}